

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_node_effects.cpp
# Opt level: O2

void __thiscall
PixelDist_GradApply4Radial::getPixel
          (PixelDist_GradApply4Radial *this,uchar *data,Pixel *p,int x,int y)

{
  byte bVar1;
  undefined2 uVar2;
  int iVar3;
  int iVar4;
  ImageData *this_00;
  uchar *puVar5;
  int x_00;
  float fVar6;
  float fVar7;
  float fVar8;
  
  iVar4 = (int)((*(float *)data + this->radOuter) * this->distScale);
  iVar3 = (this->grad).image.w;
  x_00 = iVar3 + -1;
  if (iVar4 < iVar3) {
    x_00 = iVar4;
  }
  if (x_00 < 1) {
    x_00 = 0;
  }
  this_00 = asImage(&(this->grad).image);
  puVar5 = fe::ImageData::getPixelPtr(this_00,x_00,0);
  uVar2 = *(undefined2 *)(puVar5 + 1);
  bVar1 = puVar5[3];
  fVar6 = this->radSharpOuter + *(float *)data;
  fVar7 = 0.0;
  if (0.0 <= fVar6) {
    fVar7 = fVar6;
  }
  fVar6 = 1.0;
  if (fVar7 <= 1.0) {
    fVar6 = fVar7;
  }
  fVar8 = this->radSharpInner - *(float *)data;
  fVar7 = 0.0;
  if (0.0 <= fVar8) {
    fVar7 = fVar8;
  }
  fVar8 = 1.0;
  if (fVar7 <= 1.0) {
    fVar8 = fVar7;
  }
  (p->field_0).field_0.bytes[0] = *puVar5;
  *(undefined2 *)((long)&p->field_0 + 1) = uVar2;
  (p->field_0).field_0.bytes[3] =
       (uchar)((int)((int)(fVar8 * 255.0) * (int)(fVar6 * 255.0) * (uint)bVar1) / 0xfe01);
  return;
}

Assistant:

void getPixel(GET_PIXEL_ARGS) const
    {
        PixelR8G8B8A8 gp;
        Pixel g;

        const fe_image& image = grad.image;

        const PixDist* pp = (PixDist*)data;

        int gx = int((pp->d1 + radOuter) * distScale);
        if (gx >= image.w)
            gx = image.w - 1;
        if (gx < 0)
            gx = 0;

        gp.getPixel(asImage(&image)->getPixelPtr(gx, 0), g, OPERATOR_ARGS_PASS);
        int a1 = getAlphaRadOpt(-pp->d1, radSharpOuter, 1.0f);
        int a2 = getAlphaRadOpt(pp->d1, radSharpInner, 1.0f);

        p.r = g.r;
        p.g = g.g;
        p.b = g.b;

        p.a = g.a * a1  * a2 / 255 / 255;
    }